

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O3

QString * __thiscall
QFileSystemEntry::completeBaseName(QString *__return_storage_ptr__,QFileSystemEntry *this)

{
  short sVar1;
  qsizetype n;
  
  findFileNameSeparators(this);
  if ((long)this->m_firstDotInFileName < 0) {
    sVar1 = this->m_lastSeparator;
    n = -1;
  }
  else {
    sVar1 = this->m_lastSeparator;
    n = ((long)this->m_lastDotInFileName + (long)this->m_firstDotInFileName) - (ulong)(sVar1 != -1);
  }
  QString::mid(__return_storage_ptr__,&this->m_filePath,(long)sVar1 + 1,n);
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemEntry::completeBaseName() const
{
    findFileNameSeparators();
    int length = -1;
    if (m_firstDotInFileName >= 0) {
        length = m_firstDotInFileName + m_lastDotInFileName;
        if (m_lastSeparator != -1) // avoid off by one
            length--;
    }
#if defined(Q_OS_WIN)
    if (m_lastSeparator == -1 && m_filePath.length() >= 2 && m_filePath.at(1) == u':')
        return m_filePath.mid(2, length - 2);
#endif
    return m_filePath.mid(m_lastSeparator + 1, length);
}